

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::GetDefaultMessageInstance(Reflection *this,FieldDescriptor *field)

{
  MessageFactory *pMVar1;
  bool bVar2;
  int iVar3;
  MessageFactory *pMVar4;
  Descriptor *pDVar5;
  undefined4 extraout_var;
  FieldOptions *this_00;
  Message **ppMVar6;
  undefined4 extraout_var_00;
  Message *res_1;
  Message *res;
  atomic<const_google::protobuf::Message_*> *ptr;
  FieldDescriptor *field_local;
  Reflection *this_local;
  
  pMVar1 = this->message_factory_;
  pMVar4 = MessageFactory::generated_factory();
  if (pMVar1 == pMVar4) {
    res_1 = std::atomic<const_google::protobuf::Message_*>::load
                      (&(field->field_22).default_generated_instance_,memory_order_acquire);
    if (res_1 == (__pointer_type)0x0) {
      pMVar1 = this->message_factory_;
      pDVar5 = FieldDescriptor::message_type(field);
      iVar3 = (*pMVar1->_vptr_MessageFactory[2])(pMVar1,pDVar5);
      res_1 = (Message *)CONCAT44(extraout_var,iVar3);
      std::atomic<const_google::protobuf::Message_*>::store
                (&(field->field_22).default_generated_instance_,res_1,memory_order_release);
    }
    this_local = (Reflection *)res_1;
  }
  else {
    bVar2 = FieldDescriptor::is_extension(field);
    if (!bVar2) {
      this_00 = FieldDescriptor::options(field);
      bVar2 = FieldOptions::weak(this_00);
      if (((!bVar2) && (bVar2 = IsLazyField(this,field), !bVar2)) &&
         (bVar2 = internal::ReflectionSchema::InRealOneof(&this->schema_,field), !bVar2)) {
        ppMVar6 = DefaultRaw<google::protobuf::Message_const*>(this,field);
        if (*ppMVar6 != (Message *)0x0) {
          return *ppMVar6;
        }
      }
    }
    pMVar1 = this->message_factory_;
    pDVar5 = FieldDescriptor::message_type(field);
    iVar3 = (*pMVar1->_vptr_MessageFactory[2])(pMVar1,pDVar5);
    this_local = (Reflection *)CONCAT44(extraout_var_00,iVar3);
  }
  return (Message *)this_local;
}

Assistant:

const Message* Reflection::GetDefaultMessageInstance(
    const FieldDescriptor* field) const {
  // If we are using the generated factory, we cache the prototype in the field
  // descriptor for faster access.
  // The default instances of generated messages are not cross-linked, which
  // means they contain null pointers on their message fields and can't be used
  // to get the default of submessages.
  if (message_factory_ == MessageFactory::generated_factory()) {
    auto& ptr = field->default_generated_instance_;
    auto* res = ptr.load(std::memory_order_acquire);
    if (res == nullptr) {
      // First time asking for this field's default. Load it and cache it.
      res = message_factory_->GetPrototype(field->message_type());
      ptr.store(res, std::memory_order_release);
    }
    return res;
  }

  // For other factories, we try the default's object field.
  // In particular, the DynamicMessageFactory will cross link the default
  // instances to allow for this. But only do this for real fields.
  // This is an optimization to avoid going to GetPrototype() below, as that
  // requires a lock and a map lookup.
  if (!field->is_extension() && !field->options().weak() &&
      !IsLazyField(field) && !schema_.InRealOneof(field)) {
    auto* res = DefaultRaw<const Message*>(field);
    if (res != nullptr) {
      return res;
    }
  }
  // Otherwise, just go to the factory.
  return message_factory_->GetPrototype(field->message_type());
}